

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_haiku.c
# Opt level: O3

int main(int argc,char **argv)

{
  Flair *pFVar1;
  bool bVar2;
  double dVar3;
  byte bVar4;
  char cVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  ALLEGRO_SAMPLE *pAVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  Flair **ppFVar14;
  Sprite *pSVar15;
  int i;
  ulong uVar16;
  Interp func;
  Flair *pFVar17;
  Flair *pFVar18;
  int iVar19;
  Token *pTVar20;
  float *pfVar21;
  char *format;
  long lVar22;
  ALLEGRO_SAMPLE *(*papAVar23) [8];
  int iVar24;
  float fVar25;
  undefined4 uVar26;
  float duration;
  float fVar27;
  float fVar28;
  ALLEGRO_EVENT event;
  int local_b8 [2];
  ALLEGRO_TIMER *local_b0;
  int local_98;
  int local_94;
  int local_78;
  
  cVar5 = al_install_system(0x85020700,atexit);
  if (cVar5 == '\0') {
    format = "Error initialising Allegro.\n";
  }
  else {
    cVar5 = al_install_audio();
    if (cVar5 == '\0') goto LAB_00103ccf;
    cVar5 = al_reserve_samples(0x80);
    if (cVar5 == '\0') goto LAB_00103ccf;
    al_init_acodec_addon();
    al_init_image_addon();
    al_set_new_bitmap_flags(0xc0);
    display = (ALLEGRO_DISPLAY *)al_create_display(0x400,600);
    if (display == (ALLEGRO_DISPLAY *)0x0) {
      format = "Error creating display.\n";
    }
    else {
      al_set_window_title(display,"Haiku - A Musical Instrument");
      images[0] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/earth4.png");
      images[1] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/wind3.png");
      images[2] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/water.png");
      images[3] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/fire.png");
      images[4] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/black_bead_opaque_A.png");
      images[5] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/dropshadow.png");
      images[8] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/air_effect.png");
      images[9] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/water_droplets.png");
      images[10] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/flame2.png");
      images[0xb] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/main_flame2.png");
      images[6] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/healthy_glow.png");
      images[7] = (ALLEGRO_BITMAP *)al_load_bitmap("data/haiku/overlay_pretty.png");
      lVar10 = 0;
      do {
        if (*(long *)((long)images + lVar10) == 0) goto LAB_00103cc1;
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x60);
      papAVar23 = element_samples;
      lVar10 = 0;
      do {
        iVar19 = (&DAT_00105264)[lVar10];
        lVar22 = 0;
        do {
          sprintf((char *)local_b8,"data/haiku/%s_%d.ogg",(long)&DAT_00105264 + (long)iVar19);
          pAVar11 = (ALLEGRO_SAMPLE *)al_load_sample(local_b8);
          (*papAVar23)[lVar22] = pAVar11;
          if (pAVar11 == (ALLEGRO_SAMPLE *)0x0) {
            abort_example("Error loading %s.\n",local_b8);
            goto LAB_00103cc1;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 8);
        lVar10 = lVar10 + 1;
        papAVar23 = papAVar23 + 1;
      } while (lVar10 != 4);
      select_sample = (ALLEGRO_SAMPLE *)al_load_sample("data/haiku/select.ogg");
      if (select_sample != (ALLEGRO_SAMPLE *)0x0) {
        uVar16 = 0;
        pTVar20 = tokens;
        do {
          uVar8 = (uint)(uVar16 >> 4) & 0xfffffff;
          fVar27 = (float)((uint)uVar16 & 0xf) * 51.2 + 125.6;
          fVar28 = (float)uVar8 * 51.2 + 80.0;
          tokens[uVar16].type = 4;
          tokens[uVar16].x = fVar27;
          tokens[uVar16].y = fVar28;
          tokens[uVar16].pitch = 7 - uVar8;
          tokens[uVar16].bot.image = 4;
          tokens[uVar16].bot.x = fVar27;
          tokens[uVar16].bot.y = fVar28;
          tokens[uVar16].bot.scale_x = 0.8;
          tokens[uVar16].bot.align_x = 0.5;
          tokens[uVar16].bot.g = 1.0;
          tokens[uVar16].bot.b = 1.0;
          tokens[uVar16].bot.scale_y = 0.8;
          tokens[uVar16].bot.align_y = 0.5;
          tokens[uVar16].bot.angle = 0.0;
          tokens[uVar16].bot.r = 1.0;
          tokens[uVar16].bot.opacity = 0.4;
          lVar10 = 0x40;
          do {
            *(undefined8 *)((long)((pTVar20->bot).anims + -2) + lVar10) = 0;
            lVar10 = lVar10 + 0x20;
          } while (lVar10 != 0x180);
          tokens[uVar16].top.image = 4;
          tokens[uVar16].top.x = fVar27;
          tokens[uVar16].top.y = fVar28;
          tokens[uVar16].top.scale_x = 0.8;
          tokens[uVar16].top.align_x = 0.5;
          tokens[uVar16].top.g = 1.0;
          tokens[uVar16].top.b = 1.0;
          tokens[uVar16].top.scale_y = 0.8;
          tokens[uVar16].top.align_y = 0.5;
          tokens[uVar16].top.angle = 0.0;
          tokens[uVar16].top.r = 1.0;
          tokens[uVar16].top.opacity = 0.0;
          lVar10 = 0x1b0;
          do {
            *(undefined8 *)((long)((pTVar20->bot).anims + -2) + lVar10) = 0;
            lVar10 = lVar10 + 0x20;
          } while (lVar10 != 0x2f0);
          uVar16 = uVar16 + 1;
          pTVar20 = pTVar20 + 1;
        } while (uVar16 != 0x80);
        lVar10 = 0;
        uVar26 = 0x43160000;
        fVar27 = 0.0;
        pTVar20 = buttons;
        do {
          fVar28 = (float)(&DAT_00105170)[lVar10] * 150.0 + 512.0;
          buttons[lVar10].type = (uint)lVar10;
          buttons[lVar10].x = fVar28;
          buttons[lVar10].y = 520.0;
          buttons[lVar10].bot.image = 5;
          buttons[lVar10].bot.x = fVar28;
          buttons[lVar10].bot.scale_x = 0.6;
          buttons[lVar10].bot.align_x = 0.5;
          buttons[lVar10].bot.y = 520.0;
          buttons[lVar10].bot.scale_y = 0.6;
          buttons[lVar10].bot.angle = 0.0;
          buttons[lVar10].bot.r = 1.0;
          buttons[lVar10].bot.g = 1.0;
          buttons[lVar10].bot.b = 1.0;
          buttons[lVar10].bot.opacity = 0.4;
          lVar22 = 0x40;
          do {
            *(undefined8 *)((long)((pTVar20->bot).anims + -2) + lVar22) = 0;
            lVar22 = lVar22 + 0x20;
          } while (lVar22 != 0x180);
          buttons[lVar10].bot.align_y = 0.0;
          buttons[lVar10].top.image = (uint)lVar10;
          buttons[lVar10].top.x = fVar28;
          buttons[lVar10].top.scale_x = 0.8;
          buttons[lVar10].top.align_x = 0.5;
          buttons[lVar10].top.y = 520.0;
          buttons[lVar10].top.scale_y = 0.8;
          buttons[lVar10].top.align_y = 0.5;
          buttons[lVar10].top.angle = 0.0;
          buttons[lVar10].top.r = 1.0;
          buttons[lVar10].top.g = 1.0;
          buttons[lVar10].top.b = 1.0;
          buttons[lVar10].top.opacity = 1.0;
          lVar22 = 0x1b0;
          do {
            *(undefined8 *)((long)((pTVar20->bot).anims + -2) + lVar22) = 0;
            lVar22 = lVar22 + 0x20;
          } while (lVar22 != 0x2f0);
          lVar10 = lVar10 + 1;
          pTVar20 = pTVar20 + 1;
        } while (lVar10 != 4);
        glow.image = 6;
        glow.scale_y = 1.0;
        glow.x = 512.0;
        glow.scale_x = 1.0;
        glow.align_x = 0.5;
        glow.y = 600.0;
        glow.angle = 0.0;
        glow.opacity = 1.0;
        lVar10 = 0x30;
        do {
          *(undefined8 *)((long)glow.anims + lVar10 + -0x30) = 0;
          lVar10 = lVar10 + 0x20;
        } while (lVar10 != 0x170);
        glow.align_y = 1.0;
        glow.b = 0.0;
        glow.r = 0.0;
        glow.g = 0.0;
        glow_overlay.image = 7;
        glow_overlay.y = 0.0;
        glow_overlay.scale_y = 1.0;
        glow_overlay.x = 0.0;
        glow_overlay.scale_x = 1.0;
        glow_overlay.angle = 0.0;
        glow_overlay.opacity = 1.0;
        lVar10 = 0x30;
        do {
          *(undefined8 *)((long)glow_overlay.anims + lVar10 + -0x30) = 0;
          lVar10 = lVar10 + 0x20;
        } while (lVar10 != 0x170);
        glow_overlay.align_x = 0.0;
        glow_overlay.align_y = 0.0;
        glow_overlay.b = 0.0;
        glow_overlay.r = 0.0;
        glow_overlay.g = 0.0;
        uVar12 = al_map_rgb(0x6b,0x8e,0x23);
        glow_color[0].b = (float)uVar26;
        glow_color[0].r = (float)(int)uVar12;
        glow_color[0].g = (float)(int)((ulong)uVar12 >> 0x20);
        glow_color[0].a = fVar27;
        uVar12 = al_map_rgb(0xad,0xd8,0xe6);
        glow_color[1].b = (float)uVar26;
        glow_color[1].r = (float)(int)uVar12;
        glow_color[1].g = (float)(int)((ulong)uVar12 >> 0x20);
        glow_color[1].a = fVar27;
        uVar12 = al_map_rgb(0x41,0x69,0xe1);
        glow_color[2].b = (float)uVar26;
        glow_color[2].r = (float)(int)uVar12;
        glow_color[2].g = (float)(int)((ulong)uVar12 >> 0x20);
        glow_color[2].a = fVar27;
        uVar12 = al_map_rgb(0xff,0,0);
        glow_color[3].b = (float)uVar26;
        glow_color[3].r = (float)(int)uVar12;
        glow_color[3].g = (float)(int)((ulong)uVar12 >> 0x20);
        glow_color[3].a = fVar27;
        select_button(buttons);
        al_install_keyboard();
        al_install_mouse();
        refresh_timer = (ALLEGRO_TIMER *)al_create_timer(0x11111111);
        playback_timer = (ALLEGRO_TIMER *)al_create_timer(0x60000000);
        uVar12 = al_create_event_queue();
        uVar13 = al_get_display_event_source(display);
        al_register_event_source(uVar12,uVar13);
        uVar13 = al_get_keyboard_event_source();
        al_register_event_source(uVar12,uVar13);
        uVar13 = al_get_mouse_event_source();
        al_register_event_source(uVar12,uVar13);
        uVar13 = al_get_timer_event_source(refresh_timer);
        al_register_event_source(uVar12,uVar13);
        uVar13 = al_get_timer_event_source(playback_timer);
        al_register_event_source(uVar12,uVar13);
        cVar5 = al_is_touch_input_installed();
        if (cVar5 != '\0') {
          uVar13 = al_get_touch_input_mouse_emulation_event_source();
          al_register_event_source(uVar12,uVar13);
        }
        al_start_timer(refresh_timer);
        al_start_timer(playback_timer);
        do {
          bVar6 = al_is_event_queue_empty(uVar12);
          if (bVar6 != 0) {
            dVar3 = (double)al_get_time();
            fVar27 = (float)dVar3;
            if (flairs != (Flair *)0x0) {
              pFVar17 = (Flair *)0x0;
              pFVar18 = flairs;
              do {
                pFVar1 = pFVar18->next;
                if (pFVar18->end_time <= fVar27) {
                  ppFVar14 = &pFVar17->next;
                  if (pFVar17 == (Flair *)0x0) {
                    ppFVar14 = &flairs;
                  }
                  ((Flair *)ppFVar14)->next = pFVar1;
                  free(pFVar18);
                  pFVar18 = pFVar17;
                }
                pFVar17 = pFVar18;
                pFVar18 = pFVar1;
              } while (pFVar1 != (Flair *)0x0);
            }
            lVar10 = 0x80;
            pSVar15 = &tokens[0].top;
            do {
              update_sprite_anims(pSVar15 + -1,fVar27);
              update_sprite_anims(pSVar15,fVar27);
              pSVar15 = (Sprite *)&pSVar15[2].y;
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
            lVar10 = 4;
            pSVar15 = &buttons[0].top;
            do {
              update_sprite_anims(pSVar15 + -1,fVar27);
              update_sprite_anims(pSVar15,fVar27);
              pSVar15 = (Sprite *)&pSVar15[2].y;
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
            update_sprite_anims(&glow,fVar27);
            update_sprite_anims(&glow_overlay,fVar27);
            for (pFVar18 = flairs; pFVar18 != (Flair *)0x0; pFVar18 = pFVar18->next) {
              update_sprite_anims(&pFVar18->sprite,fVar27);
            }
            al_map_rgb(0,0,0);
            al_clear_to_color();
            al_set_blender(0,2,1);
            draw_sprite(&glow);
            draw_sprite(&glow_overlay);
            lVar10 = 0x80;
            pSVar15 = &tokens[0].top;
            do {
              draw_sprite(pSVar15 + -1);
              draw_sprite(pSVar15);
              pSVar15 = (Sprite *)&pSVar15[2].y;
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
            al_set_blender(0,1,3);
            lVar10 = 4;
            pSVar15 = &buttons[0].top;
            do {
              draw_sprite(pSVar15 + -1);
              draw_sprite(pSVar15);
              pSVar15 = (Sprite *)&pSVar15[2].y;
              lVar10 = lVar10 + -1;
            } while (lVar10 != 0);
            al_set_blender(0,2,1);
            for (pFVar18 = flairs; pFVar18 != (Flair *)0x0; pFVar18 = pFVar18->next) {
              draw_sprite(&pFVar18->sprite);
            }
            al_flip_display();
          }
          bVar6 = bVar6 ^ 1;
          do {
            al_wait_for_event();
            if (local_b0 == refresh_timer) break;
            if (local_b0 == playback_timer) {
              iVar19 = 0;
              do {
                lVar10 = (long)playback_column + (long)iVar19 * 0x10;
                if (3 < tokens[lVar10].type) goto LAB_00103a82;
                pSVar15 = &tokens[lVar10].top;
                switch(tokens[lVar10].type) {
                case 0:
                  al_play_sample(0x3f4ccccd,0,0x3f800000,element_samples[0][tokens[lVar10].pitch],
                                 0x100,0);
                  fVar27 = tokens[lVar10].top.scale_x;
                  anim_full(pSVar15,&tokens[lVar10].top.scale_x,fVar27 + 0.4,fVar27,INTERP_FAST,0.0,
                            0.3);
                  fVar27 = tokens[lVar10].top.scale_y;
                  pfVar21 = &tokens[lVar10].top.scale_y;
                  fVar28 = fVar27 + 0.4;
                  fVar25 = 0.3;
                  goto LAB_00103a7d;
                case 1:
                  al_play_sample(0x3f4ccccd,0,element_samples[1][tokens[lVar10].pitch],0x100,0);
                  pfVar21 = &tokens[lVar10].top.scale_x;
                  anim_full(pSVar15,pfVar21,0.8,0.64,INTERP_SLOW_IN_OUT,0.0,0.5);
                  anim_full(pSVar15,pfVar21,0.64,0.8,INTERP_SLOW_IN_OUT,0.5,0.8);
                  pfVar21 = &tokens[lVar10].top.scale_y;
                  anim_full(pSVar15,pfVar21,0.8,0.64,INTERP_SLOW_IN_OUT,0.0,0.5);
                  anim_full(pSVar15,pfVar21,0.64,0.8,INTERP_SLOW_IN_OUT,0.5,0.8);
                  fVar27 = tokens[lVar10].top.x;
                  fVar28 = tokens[lVar10].top.y;
                  dVar3 = (double)al_get_time();
                  pSVar15 = make_flair(8,fVar27,fVar28,(float)dVar3 + 1.0);
                  anim_full(pSVar15,&pSVar15->scale_x,0.9,1.3,INTERP_FAST,0.0,1.0);
                  anim_full(pSVar15,&pSVar15->scale_y,0.9,1.3,INTERP_FAST,0.0,1.0);
                  anim_full(pSVar15,&pSVar15->opacity,1.0,0.0,INTERP_FAST,0.0,1.0);
                  pSVar15 = make_flair(8,fVar27,fVar28,(float)dVar3 + 1.2);
                  anim_full(pSVar15,&pSVar15->opacity,1.0,0.0,INTERP_LINEAR,0.0,1.2);
                  anim_full(pSVar15,&pSVar15->scale_x,1.1,1.5,INTERP_FAST,0.0,1.2);
                  anim_full(pSVar15,&pSVar15->scale_y,1.1,0.5,INTERP_FAST,0.0,1.2);
                  pfVar21 = &pSVar15->x;
                  fVar28 = pSVar15->x;
                  fVar27 = fVar28 + 10.0;
                  fVar25 = 1.2;
LAB_00103a7d:
                  anim_full(pSVar15,pfVar21,fVar28,fVar27,INTERP_FAST,0.0,fVar25);
                  break;
                case 2:
                  al_play_sample(0x3f333333,0x3f000000,element_samples[2][tokens[lVar10].pitch],
                                 0x100,0);
                  pfVar21 = &tokens[lVar10].top.scale_x;
                  anim_full(pSVar15,pfVar21,1.04,0.64,INTERP_BOUNCE,0.0,0.5);
                  anim_full(pSVar15,pfVar21,0.64,0.8,INTERP_BOUNCE,0.5,0.5);
                  pfVar21 = &tokens[lVar10].top.scale_y;
                  anim_full(pSVar15,pfVar21,0.64,1.04,INTERP_BOUNCE,0.0,0.5);
                  anim_full(pSVar15,pfVar21,1.04,0.8,INTERP_BOUNCE,0.5,0.5);
                  fVar27 = tokens[lVar10].top.x;
                  fVar28 = tokens[lVar10].top.y;
                  dVar3 = (double)al_get_time();
                  pSVar15 = make_flair(2,fVar27,fVar28,(float)dVar3 + 1.0);
                  anim_full(pSVar15,&pSVar15->scale_x,1.0,2.0,INTERP_FAST,0.0,0.5);
                  anim_full(pSVar15,&pSVar15->scale_y,1.0,2.0,INTERP_FAST,0.0,0.5);
                  anim_full(pSVar15,&pSVar15->opacity,0.5,0.0,INTERP_FAST,0.0,0.5);
                  iVar24 = 9;
                  do {
                    pSVar15 = make_flair(9,fVar27,fVar28,(float)dVar3 + 1.0);
                    iVar7 = rand();
                    fVar25 = (float)iVar7 * 4.656613e-10 * 0.90000004 + 0.3;
                    uVar8 = rand();
                    if ((uVar8 & 1) != 0) {
                      fVar25 = -fVar25;
                    }
                    pSVar15->scale_x = fVar25;
                    iVar7 = rand();
                    fVar25 = (float)iVar7 * 4.656613e-10 * 0.90000004 + 0.3;
                    uVar8 = rand();
                    if ((uVar8 & 1) != 0) {
                      fVar25 = -fVar25;
                    }
                    pSVar15->scale_y = fVar25;
                    iVar7 = rand();
                    pSVar15->angle = (float)iVar7 * 4.656613e-10 * 6.2831855 + 0.0;
                    iVar7 = rand();
                    pSVar15->r = (float)iVar7 * 4.656613e-10 * 0.6 + 0.0;
                    iVar7 = rand();
                    pSVar15->g = (float)iVar7 * 4.656613e-10 * 0.20000002 + 0.4;
                    pSVar15->b = 1.0;
                    if (iVar24 == 9) {
                      fVar25 = pSVar15->opacity;
                      func = INTERP_LINEAR;
                      duration = 1.0;
                    }
                    else {
                      iVar7 = rand();
                      duration = (float)iVar7 * 4.656613e-10 * 0.3 + 0.7;
                      fVar25 = pSVar15->opacity;
                      func = INTERP_DOUBLE_SLOW;
                    }
                    anim_full(pSVar15,&pSVar15->opacity,fVar25,0.0,func,0.0,duration);
                    iVar7 = rand();
                    iVar9 = rand();
                    anim_full(pSVar15,&pSVar15->scale_x,pSVar15->scale_x,
                              (float)iVar7 * 4.656613e-10 * 2.2 + 0.8,INTERP_FAST,0.0,
                              (float)iVar9 * 4.656613e-10 * 0.3 + 0.7);
                    iVar7 = rand();
                    iVar9 = rand();
                    anim_full(pSVar15,&pSVar15->scale_y,pSVar15->scale_y,
                              (float)iVar7 * 4.656613e-10 * 2.2 + 0.8,INTERP_FAST,0.0,
                              (float)iVar9 * 4.656613e-10 * 0.3 + 0.7);
                    iVar7 = rand();
                    fVar25 = (float)iVar7 * 4.656613e-10 * 20.0 + 0.0;
                    uVar8 = rand();
                    if ((uVar8 & 1) != 0) {
                      fVar25 = -fVar25;
                    }
                    iVar7 = rand();
                    anim_full(pSVar15,&pSVar15->x,pSVar15->x,fVar25 + pSVar15->x,INTERP_FAST,0.0,
                              (float)iVar7 * 4.656613e-10 * 0.3 + 0.7);
                    iVar7 = rand();
                    fVar25 = (float)iVar7 * 4.656613e-10 * 20.0 + 0.0;
                    uVar8 = rand();
                    if ((uVar8 & 1) != 0) {
                      fVar25 = -fVar25;
                    }
                    iVar7 = rand();
                    anim_full(pSVar15,&pSVar15->y,pSVar15->y,fVar25 + pSVar15->y,INTERP_FAST,0.0,
                              (float)iVar7 * 4.656613e-10 * 0.3 + 0.7);
                    iVar24 = iVar24 + -1;
                  } while (iVar24 != 0);
                  break;
                case 3:
                  iVar24 = 0;
                  al_play_sample(0x3f4ccccd,0,element_samples[3][tokens[lVar10].pitch],0x100,0);
                  anim_full(pSVar15,&tokens[lVar10].top.scale_x,1.04,0.8,INTERP_SLOW_IN_OUT,0.0,1.0)
                  ;
                  anim_full(pSVar15,&tokens[lVar10].top.scale_y,1.04,0.8,INTERP_SLOW_IN_OUT,0.0,1.0)
                  ;
                  fVar27 = tokens[lVar10].top.x;
                  fVar28 = tokens[lVar10].top.y;
                  dVar3 = (double)al_get_time();
                  pSVar15 = make_flair(0xb,fVar27,fVar28,(float)dVar3 + 0.8);
                  pSVar15->align_y = 0.75;
                  anim_full(pSVar15,&pSVar15->scale_x,0.2,1.3,INTERP_BOUNCE,0.0,0.4);
                  anim_full(pSVar15,&pSVar15->scale_y,0.2,1.3,INTERP_BOUNCE,0.0,0.4);
                  anim_full(pSVar15,&pSVar15->scale_x,1.3,1.4,INTERP_BOUNCE,0.4,0.5);
                  anim_full(pSVar15,&pSVar15->scale_y,1.3,1.4,INTERP_BOUNCE,0.4,0.5);
                  anim_full(pSVar15,&pSVar15->opacity,1.0,0.0,INTERP_FAST,0.3,0.5);
                  do {
                    pSVar15 = make_flair(10,fVar27,fVar28,(float)dVar3 + 0.7);
                    pSVar15->align_x = 1.3;
                    fVar25 = (float)iVar24 * 2.0943952;
                    pSVar15->angle = fVar25;
                    anim_full(pSVar15,&pSVar15->angle,fVar25,fVar25 + -3.1415927,INTERP_DOUBLE_FAST,
                              0.0,0.7);
                    anim_full(pSVar15,&pSVar15->opacity,1.0,0.0,INTERP_SLOW,0.0,0.7);
                    anim_full(pSVar15,&pSVar15->scale_x,0.2,1.0,INTERP_FAST,0.0,0.7);
                    anim_full(pSVar15,&pSVar15->scale_y,0.2,1.0,INTERP_FAST,0.0,0.7);
                    iVar24 = iVar24 + 1;
                  } while (iVar24 != 3);
                }
LAB_00103a82:
                iVar19 = iVar19 + 1;
              } while (iVar19 != 8);
              bVar2 = 0xe < playback_column;
              playback_column = playback_column + 1;
              if (bVar2) {
                playback_column = 0;
              }
            }
            else if (local_b8[0] < 0x15) {
              if (local_b8[0] == 10) {
                if (local_98 == 3) {
                  lVar10 = 0;
                  do {
                    unselect_token((Token *)((long)(tokens[0].bot.anims + -2) + lVar10));
                    lVar10 = lVar10 + 0x2f0;
                  } while (lVar10 != 0x17800);
                }
                else if (local_98 == 0x3b) goto joined_r0x00103c81;
              }
              else if ((local_b8[0] == 0x14) &&
                      (pTVar20 = get_touched_token((float)local_98,(float)local_94),
                      pTVar20 != hover_token)) {
                if (hover_token != (Token *)0x0) {
                  anim_full(&hover_token->bot,&(hover_token->bot).opacity,(hover_token->bot).opacity
                            ,0.4,INTERP_DOUBLE_SLOW,0.0,0.2);
                }
                hover_token = pTVar20;
                if (pTVar20 != (Token *)0x0) {
                  anim_full(&pTVar20->bot,&(pTVar20->bot).opacity,(pTVar20->bot).opacity,0.7,
                            INTERP_FAST,0.0,0.2);
                }
              }
            }
            else if (local_b8[0] == 0x15) {
              fVar27 = (float)local_98;
              fVar28 = (float)local_94;
              if (local_78 == 2) {
                pTVar20 = get_touched_token(fVar27,fVar28);
                if (pTVar20 != (Token *)0x0) {
                  unselect_token(pTVar20);
                }
              }
              else if (local_78 == 1) {
                pTVar20 = get_touched_token(fVar27,fVar28);
                if (pTVar20 == (Token *)0x0) {
                  lVar10 = 0;
                  do {
                    fVar25 = *(float *)((long)buttons[0].bot.anims + lVar10 + -0x3c);
                    if ((((fVar25 + -32.0 <= fVar27) && (fVar27 < fVar25 + 32.0)) &&
                        (fVar25 = *(float *)((long)buttons[0].bot.anims + lVar10 + -0x38),
                        fVar25 + -32.0 <= fVar28)) && (fVar28 < fVar25 + 32.0)) {
                      select_button((Token *)((long)(buttons[0].bot.anims + -2) + lVar10));
                      break;
                    }
                    lVar10 = lVar10 + 0x2f0;
                  } while (lVar10 != 0xbc0);
                }
                else if (selected_button != (Token *)0x0) {
                  uVar8 = pTVar20->type;
                  unselect_token(pTVar20);
                  if (uVar8 != selected_button->type) {
                    (pTVar20->top).image = selected_button->type;
                    anim_full(&pTVar20->top,&(pTVar20->top).opacity,(pTVar20->top).opacity,1.0,
                              INTERP_FAST,0.0,0.15);
                    pTVar20->type = selected_button->type;
                  }
                }
              }
            }
            else if (local_b8[0] == 0x2a) {
joined_r0x00103c81:
              while (flairs != (Flair *)0x0) {
                pFVar18 = flairs->next;
                free(flairs);
                flairs = pFVar18;
              }
              glow.x = glow.x;
              glow.scale_x = glow.scale_x;
              glow.align_x = glow.align_x;
              glow.y = glow.y;
              glow.r = glow.r;
              glow.g = glow.g;
              glow_overlay.x = glow_overlay.x;
              glow_overlay.scale_x = glow_overlay.scale_x;
              glow_overlay.y = glow_overlay.y;
              glow_overlay.scale_y = glow_overlay.scale_y;
              glow_overlay.r = glow_overlay.r;
              glow_overlay.g = glow_overlay.g;
              return 0;
            }
            bVar4 = bVar6 & 1;
            bVar6 = 0;
          } while (bVar4 == 0);
        } while( true );
      }
      format = "Error loading select.ogg.\n";
      select_sample = (ALLEGRO_SAMPLE *)0x0;
    }
  }
LAB_00103cc8:
  do {
    abort_example(format);
LAB_00103ccf:
    format = "Error initialising audio.\n";
  } while( true );
LAB_00103cc1:
  format = "Error loading image.\n";
  goto LAB_00103cc8;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_EVENT_QUEUE *queue;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Error initialising Allegro.\n");
   }
   if (!al_install_audio() || !al_reserve_samples(128)) {
      abort_example("Error initialising audio.\n");
   }
   al_init_acodec_addon();
   al_init_image_addon();
   init_platform_specific();

   al_set_new_bitmap_flags(ALLEGRO_MIN_LINEAR | ALLEGRO_MAG_LINEAR);

   display = al_create_display(screen_w, screen_h);
   if (!display) {
      abort_example("Error creating display.\n");
   }
   al_set_window_title(display, "Haiku - A Musical Instrument");

   load_images();
   load_samples();

   init_tokens();
   init_buttons();
   init_glow();
   select_button(&buttons[TYPE_EARTH]);

   al_install_keyboard();
   al_install_mouse();

   refresh_timer = al_create_timer(1.0 / refresh_rate);
   playback_timer = al_create_timer(playback_period / TOKENS_X);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_mouse_event_source());
   al_register_event_source(queue, al_get_timer_event_source(refresh_timer));
   al_register_event_source(queue, al_get_timer_event_source(playback_timer));
   if (al_is_touch_input_installed()) {
      al_register_event_source(queue,
         al_get_touch_input_mouse_emulation_event_source());
   }

   al_start_timer(refresh_timer);
   al_start_timer(playback_timer);

   main_loop(queue);

   free_all_flairs();

   return 0;
}